

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  uchar uVar4;
  uchar uVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar6 = 1;
  for (pbVar3 = (byte *)(zSpan + 1); (pbVar3[-1] != 0 && (pbVar3[-1] != 0x2e)); pbVar3 = pbVar3 + 1)
  {
    uVar6 = uVar6 + 1;
  }
  if (zDb != (char *)0x0) {
    if (uVar6 != 1) {
      lVar8 = 0;
      uVar9 = uVar6 & 0xffffffff;
      do {
        if ((ulong)(byte)zSpan[lVar8] == 0) {
          uVar5 = ""[(byte)zDb[lVar8]];
          uVar4 = '\0';
LAB_00172b04:
          if (uVar4 != uVar5) {
            return 0;
          }
          break;
        }
        uVar4 = ""[(byte)zSpan[lVar8]];
        uVar5 = ""[(byte)zDb[lVar8]];
        if (uVar4 != uVar5) goto LAB_00172b04;
        uVar10 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar10;
        lVar8 = lVar8 + 1;
      } while (1 < uVar10);
    }
    if (zDb[uVar6 - 1] != '\0') {
      return 0;
    }
  }
  uVar6 = 1;
  pbVar1 = pbVar3;
  while( true ) {
    if ((*pbVar1 == 0) || (*pbVar1 == 0x2e)) break;
    uVar6 = uVar6 + 1;
    pbVar1 = pbVar1 + 1;
  }
  if (zTab != (char *)0x0) {
    if (uVar6 != 1) {
      uVar9 = uVar6 & 0xffffffff;
      pbVar7 = (byte *)zTab;
      do {
        if ((ulong)*pbVar3 == 0) {
          uVar5 = ""[*pbVar7];
          uVar4 = '\0';
LAB_00172b8c:
          if (uVar4 != uVar5) {
            return 0;
          }
          break;
        }
        uVar4 = ""[*pbVar3];
        uVar5 = ""[*pbVar7];
        if (uVar4 != uVar5) goto LAB_00172b8c;
        pbVar3 = pbVar3 + 1;
        pbVar7 = pbVar7 + 1;
        uVar10 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar10;
      } while (1 < uVar10);
    }
    if (zTab[uVar6 - 1] != '\0') {
      return 0;
    }
  }
  if ((zCol != (char *)0x0) && (iVar2 = sqlite3StrICmp((char *)(pbVar1 + 1),zCol), iVar2 != 0)) {
    return 0;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}